

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPChunk * ChunkSearchList(WebPChunk *first,uint32_t nth,uint32_t tag)

{
  WebPChunk *pWVar1;
  uint32_t in_EDX;
  int in_ESI;
  WebPChunk *in_RDI;
  WebPChunk *next_chunk;
  uint32_t iter;
  WebPChunk *local_30;
  int local_1c;
  WebPChunk *local_10;
  WebPChunk *local_8;
  
  pWVar1 = ChunkSearchNextInList(in_RDI,in_EDX);
  local_1c = in_ESI;
  if (pWVar1 == (WebPChunk *)0x0) {
    local_8 = (WebPChunk *)0x0;
  }
  else {
    do {
      local_10 = pWVar1;
      local_1c = local_1c + -1;
      if (local_1c == 0) break;
      pWVar1 = ChunkSearchNextInList(local_10->next_,in_EDX);
    } while (pWVar1 != (WebPChunk *)0x0);
    if ((in_ESI == 0) || (local_1c == 0)) {
      local_30 = local_10;
    }
    else {
      local_30 = (WebPChunk *)0x0;
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

WebPChunk* ChunkSearchList(WebPChunk* first, uint32_t nth, uint32_t tag) {
  uint32_t iter = nth;
  first = ChunkSearchNextInList(first, tag);
  if (first == NULL) return NULL;

  while (--iter != 0) {
    WebPChunk* next_chunk = ChunkSearchNextInList(first->next_, tag);
    if (next_chunk == NULL) break;
    first = next_chunk;
  }
  return ((nth > 0) && (iter > 0)) ? NULL : first;
}